

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unicodeOpen(sqlite3_tokenizer *p,char *aInput,int nInput,sqlite3_tokenizer_cursor **pp)

{
  sqlite3_tokenizer_cursor *__s;
  size_t sVar1;
  unicode_cursor *pCsr;
  sqlite3_tokenizer_cursor **pp_local;
  int nInput_local;
  char *aInput_local;
  sqlite3_tokenizer *p_local;
  
  __s = (sqlite3_tokenizer_cursor *)sqlite3_malloc(0x30);
  if (__s == (sqlite3_tokenizer_cursor *)0x0) {
    p_local._4_4_ = 7;
  }
  else {
    memset(__s,0,0x30);
    __s[1].pTokenizer = (sqlite3_tokenizer *)aInput;
    if (aInput == (char *)0x0) {
      *(undefined4 *)&__s[2].pTokenizer = 0;
    }
    else if (nInput < 0) {
      sVar1 = strlen(aInput);
      *(int *)&__s[2].pTokenizer = (int)sVar1;
    }
    else {
      *(int *)&__s[2].pTokenizer = nInput;
    }
    *pp = __s;
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static int unicodeOpen(
  sqlite3_tokenizer *p,           /* The tokenizer */
  const char *aInput,             /* Input string */
  int nInput,                     /* Size of string aInput in bytes */
  sqlite3_tokenizer_cursor **pp   /* OUT: New cursor object */
){
  unicode_cursor *pCsr;

  pCsr = (unicode_cursor *)sqlite3_malloc(sizeof(unicode_cursor));
  if( pCsr==0 ){
    return SQLITE_NOMEM;
  }
  memset(pCsr, 0, sizeof(unicode_cursor));

  pCsr->aInput = (const unsigned char *)aInput;
  if( aInput==0 ){
    pCsr->nInput = 0;
  }else if( nInput<0 ){
    pCsr->nInput = (int)strlen(aInput);
  }else{
    pCsr->nInput = nInput;
  }

  *pp = &pCsr->base;
  UNUSED_PARAMETER(p);
  return SQLITE_OK;
}